

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

void __thiscall
rudp::session::session
          (session *this,io_service *ios,socket *sock,endpoint *endpoint_,
          function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)> *on_closed_
          )

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  local_48;
  
  (this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
  super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
  super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->io_service = ios;
  this->socket = sock;
  uVar1 = *(undefined8 *)((long)&(endpoint_->impl_).data_ + 8);
  uVar2 = *(undefined8 *)((long)&(endpoint_->impl_).data_ + 0xc);
  uVar3 = *(undefined8 *)((long)&(endpoint_->impl_).data_ + 0x14);
  *(undefined8 *)&(this->endpoint).impl_.data_ = *(undefined8 *)&(endpoint_->impl_).data_;
  *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 8) = uVar1;
  *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 0xc) = uVar2;
  *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 0x14) = uVar3;
  session_config::session_config(&this->self_config);
  session_config::session_config(&this->remote_config);
  memset(&this->receive_buffer,0,0x1001);
  memset(&this->send_buffer,0,0x3002);
  std::
  queue<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>>
  ::
  queue<std::deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>,void>
            (&this->pending);
  memset(&this->cumulative_ack_count,0,0x183d);
  std::function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)>::function
            (&this->on_closed,on_closed_);
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __fill_a1<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>>
            ((this->receive_buffer)._M_elems,
             (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
             &this->receive_head,
             (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)&local_48)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  for (lVar4 = 0; lVar4 != 0x3000; lVar4 = lVar4 + 0x30) {
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    __shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 *)((long)&(this->send_buffer)._M_elems[0].first.
                           super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar4),&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  for (lVar4 = 0; lVar4 != 0x1800; lVar4 = lVar4 + 0x18) {
    *(undefined8 *)((long)&(this->retransmission_timer)._M_elems[0].second + lVar4) = 0;
  }
  return;
}

Assistant:

session::session(
    boost::asio::io_service &ios,
    boost::asio::ip::udp::socket &sock,
    const boost::asio::ip::udp::endpoint &endpoint_,
    const std::function< void( const boost::asio::ip::udp::endpoint& ) > &on_closed_
  ) : io_service( ios ), socket( sock ), endpoint( endpoint_ ), receive_head( 0 ), send_head( 0 ), acknowledge_head( 0 ), cumulative_ack_count( 0 ), state( session_state::initial ), client( false ), on_closed( on_closed_ ) {
    std::fill( receive_buffer.begin(), receive_buffer.end(), buffer_ptr_t() );
    std::for_each( send_buffer.begin(), send_buffer.end(), []    ( auto &v ) { v.first = buffer_ptr_t(); } );
    std::for_each( retransmission_timer.begin(), retransmission_timer.end(), []( auto &v ) { v.second = 0u; } );
  }